

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2sparse
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int *rn,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *eps2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *vec2,int *idx2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int *rn2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint *puVar1;
  bool bVar2;
  fpclass_type fVar3;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint local_31c;
  cpp_dec_float<50U,_int,_void> local_308;
  int *local_2c8;
  int32_t local_2c0;
  int local_2bc;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b8;
  int *local_2b0;
  int *local_2a8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  cpp_dec_float<50U,_int,_void> local_268;
  cpp_dec_float<50U,_int,_void> local_228;
  cpp_dec_float<50U,_int,_void> local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_68.m_backend.exp = (eps->m_backend).exp;
  local_68.m_backend.neg = (eps->m_backend).neg;
  local_68.m_backend.fpclass = (eps->m_backend).fpclass;
  local_68.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
  local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
  local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
  local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
  local_a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
  local_a8.m_backend.exp = (eps2->m_backend).exp;
  local_a8.m_backend.neg = (eps2->m_backend).neg;
  local_a8.m_backend.fpclass = (eps2->m_backend).fpclass;
  local_a8.m_backend.prec_elem = (eps2->m_backend).prec_elem;
  local_2b8 = vec;
  vSolveLright2(this,rhs,ridx,rn,&local_68,rhs2,ridx2,rn2,&local_a8);
  local_2c8 = (this->row).perm;
  local_2b0 = idx;
  local_2a0 = this;
  if (forest == (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0x0) {
    if (*rn < 1) {
      iVar5 = 0;
    }
    else {
      lVar11 = 0;
      uVar9 = 0;
      do {
        uVar8 = (uint)uVar9;
        iVar5 = ridx[lVar11];
        local_308.exp = rhs[iVar5].m_backend.exp;
        local_308.neg = rhs[iVar5].m_backend.neg;
        local_308.data._M_elems._32_8_ = *(undefined8 *)(rhs[iVar5].m_backend.data._M_elems + 8);
        local_308.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar5].m_backend.data._M_elems;
        local_308.data._M_elems._8_8_ = *(undefined8 *)(rhs[iVar5].m_backend.data._M_elems + 2);
        puVar1 = rhs[iVar5].m_backend.data._M_elems + 4;
        local_308.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_308.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_308.fpclass = rhs[iVar5].m_backend.fpclass;
        local_308.prec_elem = rhs[iVar5].m_backend.prec_elem;
        local_228.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_228.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_228.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_228.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_228.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_228.exp = (eps->m_backend).exp;
        local_228.neg = (eps->m_backend).neg;
        local_228.fpclass = (eps->m_backend).fpclass;
        local_228.prec_elem = (eps->m_backend).prec_elem;
        if ((local_308.neg == true) &&
           (local_308.data._M_elems[0] != 0 || local_308.fpclass != cpp_dec_float_finite)) {
          local_308.neg = false;
        }
        if ((local_228.fpclass == cpp_dec_float_NaN || local_308.fpclass == cpp_dec_float_NaN) ||
           (iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_308,&local_228), iVar4 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&rhs[iVar5].m_backend,0);
        }
        else {
          iVar5 = local_2c8[iVar5];
          uVar6 = uVar8;
          if (0 < (int)uVar8) {
            do {
              uVar10 = (uint)uVar9 - 1;
              uVar7 = uVar10 >> 1;
              uVar6 = (uint)uVar9;
              if (iVar5 <= ridx[uVar7]) break;
              ridx[uVar9] = ridx[uVar7];
              uVar9 = (ulong)uVar7;
              uVar6 = uVar7;
            } while (1 < uVar10);
          }
          uVar9 = (ulong)(uVar8 + 1);
          ridx[(int)uVar6] = iVar5;
        }
        iVar5 = (int)uVar9;
        lVar11 = lVar11 + 1;
      } while (lVar11 < *rn);
    }
    *rn = iVar5;
  }
  else {
    if (*rn < 1) {
      local_31c = 0;
    }
    else {
      local_2a8 = forestIdx;
      lVar11 = 0;
      local_31c = 0;
      do {
        iVar5 = ridx[lVar11];
        local_278 = *(undefined8 *)(rhs[iVar5].m_backend.data._M_elems + 8);
        local_298 = *(undefined8 *)rhs[iVar5].m_backend.data._M_elems;
        uStack_290 = *(undefined8 *)(rhs[iVar5].m_backend.data._M_elems + 2);
        puVar1 = rhs[iVar5].m_backend.data._M_elems + 4;
        local_288 = *(undefined8 *)puVar1;
        uStack_280 = *(undefined8 *)(puVar1 + 2);
        local_308.exp = rhs[iVar5].m_backend.exp;
        bVar2 = rhs[iVar5].m_backend.neg;
        fVar3 = rhs[iVar5].m_backend.fpclass;
        local_308.prec_elem = rhs[iVar5].m_backend.prec_elem;
        local_308.data._M_elems._32_8_ = *(undefined8 *)(rhs[iVar5].m_backend.data._M_elems + 8);
        local_308.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar5].m_backend.data._M_elems;
        local_308.data._M_elems._8_8_ = *(undefined8 *)(rhs[iVar5].m_backend.data._M_elems + 2);
        puVar1 = rhs[iVar5].m_backend.data._M_elems + 4;
        local_308.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_308.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_1e8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_1e8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_1e8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_1e8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_1e8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_1e8.exp = (eps->m_backend).exp;
        local_1e8.neg = (eps->m_backend).neg;
        local_1e8.fpclass = (eps->m_backend).fpclass;
        local_1e8.prec_elem = (eps->m_backend).prec_elem;
        local_308.fpclass = fVar3;
        local_308.neg = bVar2;
        if ((bVar2 == true) && (local_308.data._M_elems[0] != 0 || fVar3 != cpp_dec_float_finite)) {
          local_308.neg = false;
        }
        if ((local_1e8.fpclass == cpp_dec_float_NaN || fVar3 == cpp_dec_float_NaN) ||
           (local_2c0 = local_308.prec_elem, local_2bc = local_308.exp,
           iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_308,&local_1e8), iVar4 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&rhs[iVar5].m_backend,0);
        }
        else {
          *local_2a8 = iVar5;
          iVar4 = local_2c8[iVar5];
          uVar8 = local_31c;
          if (0 < (int)local_31c) {
            do {
              uVar6 = uVar8 - 1;
              uVar7 = uVar6 >> 1;
              if (iVar4 <= ridx[uVar7]) break;
              ridx[uVar8] = ridx[uVar7];
              uVar8 = uVar7;
            } while (1 < uVar6);
          }
          local_2a8 = local_2a8 + 1;
          local_31c = local_31c + 1;
          ridx[(int)uVar8] = iVar4;
          *(undefined8 *)(forest[iVar5].m_backend.data._M_elems + 8) = local_278;
          puVar1 = forest[iVar5].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar1 = local_288;
          *(undefined8 *)(puVar1 + 2) = uStack_280;
          *(undefined8 *)forest[iVar5].m_backend.data._M_elems = local_298;
          *(undefined8 *)(forest[iVar5].m_backend.data._M_elems + 2) = uStack_290;
          forest[iVar5].m_backend.exp = local_2bc;
          forest[iVar5].m_backend.neg = bVar2;
          forest[iVar5].m_backend.fpclass = fVar3;
          forest[iVar5].m_backend.prec_elem = local_2c0;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < *rn);
    }
    *rn = local_31c;
    *forestNum = local_31c;
  }
  if (*rn2 < 1) {
    iVar5 = 0;
  }
  else {
    lVar11 = 0;
    uVar9 = 0;
    do {
      uVar8 = (uint)uVar9;
      iVar5 = ridx2[lVar11];
      local_308.exp = rhs2[iVar5].m_backend.exp;
      local_308.neg = rhs2[iVar5].m_backend.neg;
      local_308.data._M_elems._32_8_ = *(undefined8 *)(rhs2[iVar5].m_backend.data._M_elems + 8);
      local_308.data._M_elems._0_8_ = *(undefined8 *)rhs2[iVar5].m_backend.data._M_elems;
      local_308.data._M_elems._8_8_ = *(undefined8 *)(rhs2[iVar5].m_backend.data._M_elems + 2);
      puVar1 = rhs2[iVar5].m_backend.data._M_elems + 4;
      local_308.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_308.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_308.fpclass = rhs2[iVar5].m_backend.fpclass;
      local_308.prec_elem = rhs2[iVar5].m_backend.prec_elem;
      local_268.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
      local_268.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
      local_268.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
      local_268.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
      local_268.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
      local_268.exp = (eps2->m_backend).exp;
      local_268.neg = (eps2->m_backend).neg;
      local_268.fpclass = (eps2->m_backend).fpclass;
      local_268.prec_elem = (eps2->m_backend).prec_elem;
      if ((local_308.neg == true) &&
         (local_308.data._M_elems[0] != 0 || local_308.fpclass != cpp_dec_float_finite)) {
        local_308.neg = false;
      }
      if ((local_268.fpclass == cpp_dec_float_NaN || local_308.fpclass == cpp_dec_float_NaN) ||
         (iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_308,&local_268), iVar4 < 1)) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&rhs2[iVar5].m_backend,0);
      }
      else {
        iVar5 = local_2c8[iVar5];
        uVar6 = uVar8;
        if (0 < (int)uVar8) {
          do {
            uVar10 = (uint)uVar9 - 1;
            uVar7 = uVar10 >> 1;
            uVar6 = (uint)uVar9;
            if (iVar5 <= ridx2[uVar7]) break;
            ridx2[uVar9] = ridx2[uVar7];
            uVar9 = (ulong)uVar7;
            uVar6 = uVar7;
          } while (1 < uVar10);
        }
        uVar9 = (ulong)(uVar8 + 1);
        ridx2[(int)uVar6] = iVar5;
      }
      iVar5 = (int)uVar9;
      lVar11 = lVar11 + 1;
    } while (lVar11 < *rn2);
  }
  this_00 = local_2a0;
  *rn2 = iVar5;
  local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_e8.m_backend.exp = (eps->m_backend).exp;
  local_e8.m_backend.neg = (eps->m_backend).neg;
  local_e8.m_backend.fpclass = (eps->m_backend).fpclass;
  local_e8.m_backend.prec_elem = (eps->m_backend).prec_elem;
  iVar5 = vSolveUright(local_2a0,local_2b8,local_2b0,rhs,ridx,*rn,&local_e8);
  *rn = iVar5;
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
  local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
  local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
  local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
  local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
  local_128.m_backend.exp = (eps2->m_backend).exp;
  local_128.m_backend.neg = (eps2->m_backend).neg;
  local_128.m_backend.fpclass = (eps2->m_backend).fpclass;
  local_128.m_backend.prec_elem = (eps2->m_backend).prec_elem;
  iVar5 = vSolveUright(this_00,vec2,idx2,rhs2,ridx2,*rn2,&local_128);
  *rn2 = iVar5;
  if ((this_00->l).updateType == 0) {
    local_168.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_168.m_backend.exp = (eps->m_backend).exp;
    local_168.m_backend.neg = (eps->m_backend).neg;
    local_168.m_backend.fpclass = (eps->m_backend).fpclass;
    local_168.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar5 = vSolveUpdateRight(this_00,local_2b8,local_2b0,*rn,&local_168);
    *rn = iVar5;
    local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
    local_1a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
    local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
    local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
    local_1a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
    local_1a8.m_backend.exp = (eps2->m_backend).exp;
    local_1a8.m_backend.neg = (eps2->m_backend).neg;
    local_1a8.m_backend.fpclass = (eps2->m_backend).fpclass;
    local_1a8.m_backend.prec_elem = (eps2->m_backend).prec_elem;
    iVar5 = vSolveUpdateRight(this_00,vec2,idx2,*rn2,&local_1a8);
    *rn2 = iVar5;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update2sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R* forest, int* forestNum, int* forestIdx)
{
   /* solve with L */
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap for both ridx and ridx2 */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   /* solve with U */
   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
   }
}